

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hydro_utils.cpp
# Opt level: O2

void HydroUtils::ComputeDivergence
               (Box *bx,Array4<double> *div,Array4<const_double> *fx,Array4<const_double> *fy,
               Array4<const_double> *fz,int ncomp,Geometry *geom,Real mult,
               bool fluxes_are_area_weighted)

{
  long lVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  long lVar14;
  long lVar15;
  long lVar16;
  long lVar17;
  long lVar18;
  double *pdVar19;
  long lVar20;
  long lVar21;
  long lVar22;
  long lVar23;
  long lVar24;
  long lVar25;
  long lVar26;
  long lVar27;
  ulong uVar28;
  int iVar29;
  long lVar30;
  long lVar31;
  long lVar32;
  long lVar33;
  ulong uVar34;
  double *pdVar35;
  long lVar36;
  long lVar37;
  long lVar38;
  long lVar39;
  long lVar40;
  double dVar41;
  double dVar42;
  double dVar43;
  double *local_170;
  double *local_168;
  double *local_160;
  double *local_158;
  double *local_138;
  double *local_130;
  double *local_110;
  double *local_100;
  
  dVar43 = (geom->super_CoordSys).inv_dx[0];
  dVar41 = (geom->super_CoordSys).inv_dx[1];
  dVar42 = (geom->super_CoordSys).inv_dx[2];
  if (fluxes_are_area_weighted) {
    dVar41 = dVar43 * dVar41 * dVar42 * mult;
    dVar42 = dVar41;
    dVar43 = dVar41;
  }
  else {
    dVar43 = dVar43 * mult;
    dVar41 = dVar41 * mult;
    dVar42 = dVar42 * mult;
  }
  lVar14 = div->kstride;
  lVar15 = fz->kstride;
  iVar2 = (fz->begin).z;
  iVar3 = (bx->smallend).vect[0];
  lVar31 = (long)iVar3;
  iVar4 = (bx->smallend).vect[2];
  lVar36 = (long)iVar4;
  uVar34 = (ulong)(uint)ncomp;
  if (ncomp < 1) {
    uVar34 = 0;
  }
  lVar25 = (long)(fz->begin).x;
  lVar16 = fy->kstride;
  lVar37 = (long)(fx->begin).z;
  lVar17 = fx->kstride;
  local_138 = fz->p + (((lVar36 - iVar2) * lVar15 + lVar31) - lVar25);
  local_110 = fz->p + (lVar31 - lVar25);
  iVar5 = (fx->begin).x;
  local_130 = div->p + (((lVar36 - (div->begin).z) * lVar14 + lVar31) - (long)(div->begin).x);
  lVar25 = div->jstride;
  lVar18 = div->nstride;
  iVar6 = (div->begin).y;
  pdVar19 = fx->p;
  lVar20 = fx->jstride;
  lVar21 = fx->nstride;
  iVar7 = (fx->begin).y;
  pdVar35 = fy->p + (((lVar36 - (fy->begin).z) * lVar16 + lVar31) - (long)(fy->begin).x);
  lVar22 = fy->nstride;
  iVar8 = (fy->begin).y;
  lVar23 = fz->jstride;
  lVar24 = fz->nstride;
  iVar9 = (fz->begin).y;
  iVar10 = (bx->smallend).vect[1];
  iVar11 = (bx->bigend).vect[0];
  iVar12 = (bx->bigend).vect[1];
  iVar13 = (bx->bigend).vect[2];
  lVar38 = fy->jstride * 8;
  local_158 = pdVar19 + (((lVar36 - lVar37) * lVar17 + lVar31) - (long)iVar5);
  for (uVar28 = 0; uVar28 != uVar34; uVar28 = uVar28 + 1) {
    local_170 = local_158;
    local_100 = local_138;
    local_168 = local_130;
    lVar31 = lVar36;
    local_160 = pdVar35;
    iVar29 = iVar4 - iVar2;
    while (iVar29 = iVar29 + 1, lVar31 <= iVar13) {
      lVar26 = lVar31 - lVar37;
      lVar31 = lVar31 + 1;
      lVar39 = (long)iVar10;
      while (lVar39 <= iVar12) {
        if (iVar11 < iVar3) {
          lVar39 = lVar39 + 1;
        }
        else {
          lVar27 = lVar39 - iVar7;
          lVar1 = lVar39 + 1;
          lVar30 = lVar39 - iVar8;
          lVar33 = (lVar39 - iVar9) * lVar23 * 8;
          lVar40 = lVar39 - iVar6;
          lVar32 = 0;
          do {
            *(double *)((long)local_168 + lVar32 * 8 + lVar40 * lVar25 * 8) =
                 (*(double *)((long)local_110 + lVar32 * 8 + lVar33 + (long)iVar29 * lVar15 * 8) -
                 *(double *)((long)local_100 + lVar32 * 8 + lVar33)) * dVar42 +
                 (*(double *)((long)local_160 + lVar32 * 8 + ((int)lVar1 - iVar8) * lVar38) -
                 *(double *)((long)local_160 + lVar32 * 8 + lVar30 * lVar38)) * dVar41 +
                 (pdVar19[uVar28 * lVar21 +
                          lVar26 * lVar17 +
                          lVar27 * lVar20 + (long)((iVar3 - iVar5) + 1 + (int)lVar32)] -
                 *(double *)((long)local_170 + lVar32 * 8 + lVar27 * lVar20 * 8)) * dVar43;
            lVar32 = lVar32 + 1;
            lVar39 = lVar1;
          } while ((iVar11 - iVar3) + 1 != (int)lVar32);
        }
      }
      local_168 = local_168 + lVar14;
      local_100 = local_100 + lVar15;
      local_160 = local_160 + lVar16;
      local_170 = local_170 + lVar17;
    }
    local_130 = local_130 + lVar18;
    local_138 = local_138 + lVar24;
    local_110 = local_110 + lVar24;
    pdVar35 = pdVar35 + lVar22;
    local_158 = local_158 + lVar21;
  }
  return;
}

Assistant:

void
HydroUtils::ComputeDivergence ( Box const& bx,
                                Array4<Real> const& div,
                                AMREX_D_DECL( Array4<Real const> const& fx,
                                              Array4<Real const> const& fy,
                                              Array4<Real const> const& fz),
                                const int ncomp, Geometry const& geom,
                                const Real mult,
                                const bool fluxes_are_area_weighted )
{
#if (AMREX_SPACEDIM == 2)
    if (geom.IsRZ()) {
        // Need metrics when using RZ
        const int ngrow_metric = 0;
        FArrayBox vol_fab;
        geom.GetVolume(vol_fab,BoxArray(bx),0,ngrow_metric);
        Elixir vol_eli = vol_fab.elixir();
        Array<FArrayBox,AMREX_SPACEDIM> area;
        Array<Elixir,AMREX_SPACEDIM> area_eli;
        if (!fluxes_are_area_weighted) {
            for (int dir = 0; dir < AMREX_SPACEDIM; ++dir)
            {
                geom.GetFaceArea(area[dir],BoxArray(bx),0,dir,ngrow_metric);
                area_eli[dir] = area[dir].elixir();
            }
        }
        const auto& vol = vol_fab.const_array();
        const auto& ax  = (fluxes_are_area_weighted) ? Array4<const Real>{}
                                                     : area[0].const_array();
        const auto& ay  = (fluxes_are_area_weighted) ? Array4<const Real>{}
                                                      : area[1].const_array();
        amrex::ParallelFor(bx, ncomp,[=]
        AMREX_GPU_DEVICE (int i, int j, int k, int n) noexcept
        {
            if (fluxes_are_area_weighted) {
                div(i,j,k,n) = ( fx(i+1,j,k,n) -  fx(i,j,k,n) +
                                 fy(i,j+1,k,n) -  fy(i,j,k,n) ) * mult / vol(i,j,k);
            } else {
                div(i,j,k,n) = ( ax(i+1,j,k)*fx(i+1,j,k,n) -  ax(i,j,k)*fx(i,j,k,n) +
                                 ay(i,j+1,k)*fy(i,j+1,k,n) -  ay(i,j,k)*fy(i,j,k,n) ) * mult / vol(i,j,k);
            }
        });
    } else
#endif
    {
        const auto dxinv = geom.InvCellSizeArray();
        AMREX_D_TERM(Real fact_x = mult;,
                     Real fact_y = mult;,
                     Real fact_z = mult;);

        if (fluxes_are_area_weighted) {
            Real qvol = AMREX_D_TERM(dxinv[0],*dxinv[1],*dxinv[2]);

            AMREX_D_TERM(fact_x *= qvol;,
                         fact_y *= qvol;,
                         fact_z *= qvol;);
        } else {
            AMREX_D_TERM(fact_x *= dxinv[0];,
                         fact_y *= dxinv[1];,
                         fact_z *= dxinv[2];);
        }

        amrex::ParallelFor(bx, ncomp,[=]
        AMREX_GPU_DEVICE (int i, int j, int k, int n) noexcept
        {
            div(i,j,k,n) = AMREX_D_TERM(  fact_x * ( fx(i+1,j,k,n) - fx(i,j,k,n) ),
                                        + fact_y * ( fy(i,j+1,k,n) - fy(i,j,k,n) ),
                                        + fact_z * ( fz(i,j,k+1,n) - fz(i,j,k,n) ));
        });
    }